

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O1

int sprkStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  int iVar1;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem local_18;
  
  local_18 = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessStepMem(ark_mem,"sprkStep_WriteParameters",&local_18);
  if (iVar1 == 0) {
    fwrite("SPRKStep time step module parameters:\n",0x26,1,(FILE *)fp);
    iVar1 = 0;
    fprintf((FILE *)fp,"  Method order %i\n",(ulong)(uint)local_18->method->q);
    fprintf((FILE *)fp,"  Method stages %i\n",(ulong)(uint)local_18->method->stages);
  }
  return iVar1;
}

Assistant:

int sprkStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* print integrator parameters to file */
  fprintf(fp, "SPRKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n", step_mem->method->q);
  fprintf(fp, "  Method stages %i\n", step_mem->method->stages);

  return (ARK_SUCCESS);
}